

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syslog_sink.h
# Opt level: O2

void __thiscall spdlog::sinks::syslog_sink<std::mutex>::~syslog_sink(syslog_sink<std::mutex> *this)

{
  ~syslog_sink(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

~syslog_sink() override { ::closelog(); }